

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimetypeparser.cpp
# Opt level: O0

void __thiscall QMimeTypeXMLData::clear(QMimeTypeXMLData *this)

{
  QList<QString> *in_RDI;
  
  *(undefined1 *)&(in_RDI->d).d = 0;
  QString::clear((QString *)in_RDI);
  QHash<QString,_QString>::clear((QHash<QString,_QString> *)in_RDI);
  QString::clear((QString *)in_RDI);
  QString::clear((QString *)in_RDI);
  QList<QString>::clear(in_RDI);
  return;
}

Assistant:

void QMimeTypeXMLData::clear()
{
    hasGlobDeleteAll = false;
    name.clear();
    localeComments.clear();
    genericIconName.clear();
    iconName.clear();
    globPatterns.clear();
}